

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool anon_unknown.dwarf_13fc48::hufBuildDecTable(longlong *hcode,int im,int iM,HufDec *hdecod)

{
  undefined1 auVar1 [16];
  uint uVar2;
  longlong lVar3;
  longlong lVar4;
  HufDec *pHVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  byte bVar9;
  long local_60;
  longlong i_1;
  HufDec *pl_1;
  int i;
  int *p;
  HufDec *pl;
  int l;
  longlong c;
  HufDec *hdecod_local;
  int iM_local;
  int im_local;
  longlong *hcode_local;
  
  hdecod_local._4_4_ = im;
  while( true ) {
    if (iM < hdecod_local._4_4_) {
      return true;
    }
    lVar3 = hufCode(hcode[hdecod_local._4_4_]);
    lVar4 = hufLength(hcode[hdecod_local._4_4_]);
    uVar2 = (uint)lVar4;
    bVar9 = (byte)lVar4;
    if (lVar3 >> (bVar9 & 0x3f) != 0) break;
    if ((int)uVar2 < 0xf) {
      if (uVar2 != 0) {
        i_1 = (longlong)(hdecod + (lVar3 << (0xe - bVar9 & 0x3f)));
        for (local_60 = (long)(1 << (0xe - bVar9 & 0x1f)); 0 < local_60; local_60 = local_60 + -1) {
          if (((char)*(undefined4 *)i_1 != '\0') || (*(long *)(i_1 + 8) != 0)) {
            return false;
          }
          *(uint *)i_1 = *(uint *)i_1 & 0xffffff00 | uVar2 & 0xff;
          *(uint *)i_1 = *(uint *)i_1 & 0xff | hdecod_local._4_4_ << 8;
          i_1 = i_1 + 0x10;
        }
      }
    }
    else {
      pHVar5 = hdecod + (lVar3 >> (bVar9 - 0xe & 0x3f));
      if ((char)*(uint *)pHVar5 != '\0') {
        return false;
      }
      *(uint *)pHVar5 = *(uint *)pHVar5 & 0xff | (((int)*(uint *)pHVar5 >> 8) + 1) * 0x100;
      if (pHVar5->p == (int *)0x0) {
        piVar8 = (int *)operator_new__(4);
        pHVar5->p = piVar8;
      }
      else {
        piVar8 = pHVar5->p;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)((int)*(uint *)pHVar5 >> 8);
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        piVar7 = (int *)operator_new__(uVar6);
        pHVar5->p = piVar7;
        for (pl_1._4_4_ = 0; pl_1._4_4_ < ((int)*(uint *)pHVar5 >> 8) + -1;
            pl_1._4_4_ = pl_1._4_4_ + 1) {
          pHVar5->p[pl_1._4_4_] = piVar8[pl_1._4_4_];
        }
        if (piVar8 != (int *)0x0) {
          operator_delete__(piVar8);
        }
      }
      pHVar5->p[((int)*(uint *)pHVar5 >> 8) + -1] = hdecod_local._4_4_;
    }
    hdecod_local._4_4_ = hdecod_local._4_4_ + 1;
  }
  return false;
}

Assistant:

bool hufBuildDecTable(const long long *hcode, // i : encoding table
                      int im,                 // i : min index in hcode
                      int iM,                 // i : max index in hcode
                      HufDec *hdecod)         //  o: (allocated by caller)
//     decoding table [HUF_DECSIZE]
{
  //
  // Init hashtable & loop on all codes.
  // Assumes that hufClearDecTable(hdecod) has already been called.
  //

  for (; im <= iM; im++) {
    long long c = hufCode(hcode[im]);
    int l = hufLength(hcode[im]);

    if (c >> l) {
      //
      // Error: c is supposed to be an l-bit code,
      // but c contains a value that is greater
      // than the largest l-bit number.
      //

      // invalidTableEntry();
      return false;
    }

    if (l > HUF_DECBITS) {
      //
      // Long code: add a secondary entry
      //

      HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

      if (pl->len) {
        //
        // Error: a short code has already
        // been stored in table entry *pl.
        //

        // invalidTableEntry();
        return false;
      }

      pl->lit++;

      if (pl->p) {
        int *p = pl->p;
        pl->p = new int[pl->lit];

        for (int i = 0; i < pl->lit - 1; ++i)
          pl->p[i] = p[i];

        delete[] p;
      } else {
        pl->p = new int[1];
      }

      pl->p[pl->lit - 1] = im;
    } else if (l) {
      //
      // Short code: init all primary entries
      //

      HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

      for (long long i = 1 << (HUF_DECBITS - l); i > 0; i--, pl++) {
        if (pl->len || pl->p) {
          //
          // Error: a short code or a long code has
          // already been stored in table entry *pl.
          //

          // invalidTableEntry();
          return false;
        }

        pl->len = l;
        pl->lit = im;
      }
    }
  }

  return true;
}